

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O0

GLuint deqp::egl::anon_unknown_0::anon_unknown_5::createTexture(Functions *gl,TestConfig *config)

{
  GLsizei GVar1;
  glTexImage2DFunc p_Var2;
  GLenum GVar3;
  reference pvVar4;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  GLuint texture;
  TestConfig *config_local;
  Functions *gl_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  createTextureData((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,config);
  (*gl->genTextures)(1,(GLuint *)
                       ((long)&data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glGenTextures()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x119);
  (*gl->bindTexture)(0xde1,data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glBindTexture()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x11b);
  (*gl->texParameteri)(0xde1,0x2801,0x2601);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glTexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x11d);
  (*gl->texParameteri)(0xde1,0x2800,0x2601);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glTexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x11f);
  (*gl->texParameteri)(0xde1,0x2803,0x812f);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glTexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x121);
  (*gl->texParameteri)(0xde1,0x2802,0x812f);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glTexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x123);
  p_Var2 = gl->texImage2D;
  GVar1 = config->textureWidth;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
  (*p_Var2)(0xde1,0,0x1908,GVar1,GVar1,0,0x1908,0x1401,pvVar4);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glTexImage2D()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x125);
  (*gl->bindTexture)(0xde1,0);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glBindTexture()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x127);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

GLuint createTexture (const glw::Functions& gl, const TestConfig& config)
{
	GLuint			texture;
	vector<deUint8>	data;

	createTextureData(data, config);

	gl.genTextures(1, &texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures()");
	gl.bindTexture(GL_TEXTURE_2D, texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture()");
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri");
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri");
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri");
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri");
	gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA, config.textureWidth, config.textureWidth, 0, GL_RGBA, GL_UNSIGNED_BYTE, &(data[0]));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D()");
	gl.bindTexture(GL_TEXTURE_2D, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture()");

	return texture;
}